

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void xmlRMutexLock(xmlRMutexPtr tok)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  uint uVar2;
  
  if (tok == (xmlRMutexPtr)0x0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)tok);
  uVar2 = tok->held;
  if (uVar2 == 0) {
    __thread2 = pthread_self();
  }
  else {
    __thread1 = tok->tid;
    __thread2 = pthread_self();
    iVar1 = pthread_equal(__thread1,__thread2);
    if (iVar1 != 0) {
      uVar2 = uVar2 + 1;
      goto LAB_00147918;
    }
    tok->waiters = tok->waiters + 1;
    do {
      pthread_cond_wait((pthread_cond_t *)&tok->cv,(pthread_mutex_t *)tok);
    } while (tok->held != 0);
    tok->waiters = tok->waiters - 1;
  }
  tok->tid = __thread2;
  uVar2 = 1;
LAB_00147918:
  tok->held = uVar2;
  pthread_mutex_unlock((pthread_mutex_t *)tok);
  return;
}

Assistant:

void
xmlRMutexLock(xmlRMutexPtr tok)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_lock(&tok->lock);
    if (tok->held) {
        if (pthread_equal(tok->tid, pthread_self())) {
            tok->held++;
            pthread_mutex_unlock(&tok->lock);
            return;
        } else {
            tok->waiters++;
            while (tok->held)
                pthread_cond_wait(&tok->cv, &tok->lock);
            tok->waiters--;
        }
    }
    tok->tid = pthread_self();
    tok->held = 1;
    pthread_mutex_unlock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    EnterCriticalSection(&tok->cs);
#endif
}